

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

void arm_cpu_synchronize_from_tb(CPUState *cs,TranslationBlock *tb)

{
  _Bool _Var1;
  CPUARMState_conflict *env;
  ARMCPU_conflict *cpu;
  TranslationBlock *tb_local;
  CPUState *cs_local;
  
  _Var1 = is_a64((CPUARMState_conflict *)(cs[1].tb_jmp_cache + 0x40b));
  if (_Var1) {
    cs[1].tb_jmp_cache[0x433] = (TranslationBlock *)tb->pc;
  }
  else {
    *(int *)((long)cs[1].tb_jmp_cache + 0x2094) = (int)tb->pc;
  }
  return;
}

Assistant:

static void arm_cpu_synchronize_from_tb(CPUState *cs, TranslationBlock *tb)
{
    ARMCPU *cpu = ARM_CPU(cs);
    CPUARMState *env = &cpu->env;

    /*
     * It's OK to look at env for the current mode here, because it's
     * never possible for an AArch64 TB to chain to an AArch32 TB.
     */
    if (is_a64(env)) {
        env->pc = tb->pc;
    } else {
        env->regs[15] = tb->pc;
    }
}